

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O1

void __thiscall
BinaryEqualFailure::BinaryEqualFailure
          (BinaryEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          uchar *expected,uchar *actual,size_t size,SimpleString *text)

{
  SimpleString *this_00;
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  size_t reportedPosition;
  SimpleString *rhs;
  long lVar5;
  undefined1 auStack_58 [32];
  SimpleString local_38;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_003a7c48;
  TestFailure::createUserText((TestFailure *)auStack_58,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)auStack_58);
  SimpleString::~SimpleString((SimpleString *)auStack_58);
  StringFromBinaryOrNull(auStack_58,(size_t)actual);
  StringFromBinaryOrNull((uchar *)&local_38,(size_t)expected);
  pcVar3 = SimpleString::asCharString(&local_38);
  pcVar4 = SimpleString::asCharString((SimpleString *)auStack_58);
  StringFromFormat(auStack_58 + 0x10,"expected <%s>\n\tbut was  <%s>",pcVar3,pcVar4);
  rhs = (SimpleString *)(auStack_58 + 0x10);
  SimpleString::operator+=(this_00,rhs);
  SimpleString::~SimpleString((SimpleString *)(auStack_58 + 0x10));
  SimpleString::~SimpleString(&local_38);
  if (actual != (uchar *)0x0 && expected != (uchar *)0x0) {
    reportedPosition = 0xfffffffffffffffe;
    lVar5 = -1;
    do {
      lVar1 = lVar5 + 1;
      reportedPosition = reportedPosition + 3;
      lVar2 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (actual[lVar1] == expected[lVar2]);
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)(auStack_58 + 0x10),rhs,(size_t)auStack_58,reportedPosition);
    SimpleString::operator+=(this_00,(SimpleString *)(auStack_58 + 0x10));
    SimpleString::~SimpleString((SimpleString *)(auStack_58 + 0x10));
  }
  SimpleString::~SimpleString((SimpleString *)auStack_58);
  return;
}

Assistant:

BinaryEqualFailure::BinaryEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const unsigned char* expected,
                                       const unsigned char* actual, size_t size, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString actualHex = StringFromBinaryOrNull(actual, size);

	message_ += createButWasString(StringFromBinaryOrNull(expected, size), actualHex);
	if ((expected) && (actual))
	{
		size_t failStart;
		for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
			;
		message_ += createDifferenceAtPosString(actualHex, (failStart * 3 + 1), failStart);
	}
}